

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O0

void __thiscall aiTexture::aiTexture(aiTexture *this)

{
  aiTexture *this_local;
  
  this->mWidth = 0;
  this->mHeight = 0;
  this->pcData = (aiTexel *)0x0;
  aiString::aiString(&this->mFilename);
  this->achFormatHint[1] = '\0';
  this->achFormatHint[0] = '\0';
  this->achFormatHint[3] = '\0';
  this->achFormatHint[2] = '\0';
  return;
}

Assistant:

aiTexture() AI_NO_EXCEPT
    : mWidth(0)
    , mHeight(0)
    , pcData(nullptr)
    , mFilename() {
        achFormatHint[0] = achFormatHint[1] = 0;
        achFormatHint[2] = achFormatHint[3] = 0;
    }